

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

void mcu8str_reserve(mcu8str *str,mcu8str_size_t nsize)

{
  int iVar1;
  char *__ptr;
  mcu8str newstr;
  mcu8str local_30;
  
  if ((ulong)str->buflen < nsize + 1) {
    mcu8str_create(&local_30,nsize);
    memcpy(local_30.c_str,str->c_str,(ulong)(str->size + 1));
    __ptr = str->c_str;
    str->c_str = local_30.c_str;
    iVar1 = str->owns_memory;
    str->buflen = local_30.buflen;
    str->owns_memory = local_30.owns_memory;
    local_30.c_str = mcu8str_dealloc::dummy;
    local_30.size = 0;
    local_30.buflen = 0;
    local_30.owns_memory = 0;
    if (__ptr != (char *)0x0 && iVar1 != 0) {
      free(__ptr);
    }
  }
  return;
}

Assistant:

void mcu8str_reserve( mcu8str* str, mcu8str_size_t nsize )
  {
    if ( nsize +1 <= str->buflen )
      return;//already has enough
    mcu8str newstr = mcu8str_create( nsize );
    //newstr.c_str can not overlap since it was just malloc'ed:
    STDNS memcpy( newstr.c_str, str->c_str, str->size + 1 );
    newstr.size = str->size;
    mcu8str_swap( str, &newstr );
    mcu8str_dealloc( &newstr );
  }